

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_shared_code_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::GenerateDescriptors
          (SharedCodeGenerator *this,Printer *printer)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *__rhs;
  FileDescriptorProto *this_00;
  FileDescriptorProto *pFVar5;
  reference pvVar6;
  FileDescriptorProto *in_RDI;
  string *dependency;
  int i_2;
  string full_name;
  string classname;
  string package;
  string filename;
  int i_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  dependencies;
  int i;
  string file_data;
  FileDescriptorProto file_proto;
  value_type *in_stack_fffffffffffffd08;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  int index;
  FileDescriptor *in_stack_fffffffffffffd20;
  string *in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  char *text;
  Printer *in_stack_fffffffffffffd70;
  int local_284;
  FileDescriptorProto *in_stack_fffffffffffffda8;
  FileDescriptor *in_stack_fffffffffffffdb0;
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [36];
  int local_17c;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  string local_160 [32];
  string local_140 [36];
  int local_11c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  char local_e8 [232];
  
  text = local_e8;
  FileDescriptorProto::FileDescriptorProto(in_RDI);
  FileDescriptor::CopyTo(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  args_1 = &local_118;
  std::__cxx11::string::string((string *)args_1);
  MessageLite::SerializeToString
            ((MessageLite *)in_stack_fffffffffffffd10,&in_stack_fffffffffffffd08->first);
  io::Printer::Print<>((Printer *)in_RDI,(char *)args_1);
  io::Printer::Indent((Printer *)0x54e9b4);
  for (local_11c = 0; uVar3 = (ulong)local_11c, uVar4 = std::__cxx11::string::size(), uVar3 < uVar4;
      local_11c = local_11c + 0x28) {
    if (0 < local_11c) {
      if (local_11c % 16000 == 0) {
        io::Printer::Print<>((Printer *)in_RDI,(char *)args_1);
      }
      else {
        io::Printer::Print<>((Printer *)in_RDI,(char *)args_1);
      }
    }
    std::__cxx11::string::substr((ulong)local_160,(ulong)&local_118);
    CEscape(in_stack_fffffffffffffd38);
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_stack_fffffffffffffd70,text,(char (*) [5])in_RDI,args_1);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_160);
  }
  io::Printer::Outdent(in_stack_fffffffffffffd70);
  io::Printer::Print<>((Printer *)in_RDI,(char *)args_1);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x54eb83);
  local_17c = 0;
  while( true ) {
    iVar1 = local_17c;
    index = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
    iVar2 = FileDescriptor::dependency_count
                      ((FileDescriptor *)
                       (in_RDI->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_);
    if (iVar2 <= iVar1) break;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            FileDescriptor::dependency(in_stack_fffffffffffffd20,index);
    __rhs = FileDescriptor::name_abi_cxx11_((FileDescriptor *)__lhs);
    std::__cxx11::string::string(local_1a0,(string *)__rhs);
    FileDescriptor::dependency(in_stack_fffffffffffffd20,index);
    FileJavaPackage_abi_cxx11_((FileDescriptor *)in_stack_fffffffffffffd08);
    in_stack_fffffffffffffd18 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         unique_ptr<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
         ::operator->((unique_ptr<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
                       *)0x54ec38);
    in_stack_fffffffffffffd20 =
         FileDescriptor::dependency
                   (in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    ClassNameResolver::GetDescriptorClassName_abi_cxx11_
              ((ClassNameResolver *)in_stack_fffffffffffffd18,
               (FileDescriptor *)in_stack_fffffffffffffd10);
    std::__cxx11::string::string(local_200);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::operator+(__lhs,(char *)__rhs);
      std::operator+(in_stack_fffffffffffffd18,&in_stack_fffffffffffffd10->first);
      std::__cxx11::string::operator=(local_200,local_220);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::string::~string(local_240);
    }
    else {
      std::__cxx11::string::operator=(local_200,local_1e0);
    }
    std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
              (in_stack_fffffffffffffd18,&in_stack_fffffffffffffd10->first);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(in_stack_fffffffffffffd10);
    std::__cxx11::string::~string(local_200);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string(local_1a0);
    local_17c = local_17c + 1;
  }
  io::Printer::Print<>((Printer *)in_RDI,(char *)args_1);
  io::Printer::Print<>((Printer *)in_RDI,(char *)args_1);
  local_284 = 0;
  while( true ) {
    this_00 = (FileDescriptorProto *)(long)local_284;
    pFVar5 = (FileDescriptorProto *)
             std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::size(&local_178);
    if (pFVar5 <= this_00) break;
    pvVar6 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&local_178,(long)local_284);
    io::Printer::Print<char[11],std::__cxx11::string>
              ((Printer *)&pvVar6->second,text,(char (*) [11])in_RDI,args_1);
    local_284 = local_284 + 1;
  }
  io::Printer::Print<>((Printer *)in_RDI,(char *)args_1);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)in_stack_fffffffffffffd20);
  std::__cxx11::string::~string((string *)&local_118);
  FileDescriptorProto::~FileDescriptorProto(this_00);
  return;
}

Assistant:

void SharedCodeGenerator::GenerateDescriptors(io::Printer* printer) {
  // Embed the descriptor.  We simply serialize the entire FileDescriptorProto
  // and embed it as a string literal, which is parsed and built into real
  // descriptors at initialization time.  We unfortunately have to put it in
  // a string literal, not a byte array, because apparently using a literal
  // byte array causes the Java compiler to generate *instructions* to
  // initialize each and every byte of the array, e.g. as if you typed:
  //   b[0] = 123; b[1] = 456; b[2] = 789;
  // This makes huge bytecode files and can easily hit the compiler's internal
  // code size limits (error "code to large").  String literals are apparently
  // embedded raw, which is what we want.
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);

  std::string file_data;
  file_proto.SerializeToString(&file_data);

  printer->Print("java.lang.String[] descriptorData = {\n");
  printer->Indent();

  // Limit the number of bytes per line.
  static const int kBytesPerLine = 40;
  // Limit the number of lines per string part.
  static const int kLinesPerPart = 400;
  // Every block of bytes, start a new string literal, in order to avoid the
  // 64k length limit. Note that this value needs to be <64k.
  static const int kBytesPerPart = kBytesPerLine * kLinesPerPart;
  for (int i = 0; i < file_data.size(); i += kBytesPerLine) {
    if (i > 0) {
      if (i % kBytesPerPart == 0) {
        printer->Print(",\n");
      } else {
        printer->Print(" +\n");
      }
    }
    printer->Print("\"$data$\"", "data",
                   CEscape(file_data.substr(i, kBytesPerLine)));
  }

  printer->Outdent();
  printer->Print("\n};\n");

  // -----------------------------------------------------------------
  // Find out all dependencies.
  std::vector<std::pair<std::string, std::string> > dependencies;
  for (int i = 0; i < file_->dependency_count(); i++) {
    std::string filename = file_->dependency(i)->name();
    std::string package = FileJavaPackage(file_->dependency(i));
    std::string classname =
        name_resolver_->GetDescriptorClassName(file_->dependency(i));
    std::string full_name;
    if (package.empty()) {
      full_name = classname;
    } else {
      full_name = package + "." + classname;
    }
    dependencies.push_back(std::make_pair(filename, full_name));
  }

  // -----------------------------------------------------------------
  // Invoke internalBuildGeneratedFileFrom() to build the file.
  printer->Print(
      "descriptor = com.google.protobuf.Descriptors.FileDescriptor\n"
      "  .internalBuildGeneratedFileFrom(descriptorData,\n");
  printer->Print(
      "    new com.google.protobuf.Descriptors.FileDescriptor[] {\n");

  for (int i = 0; i < dependencies.size(); i++) {
    const std::string& dependency = dependencies[i].second;
    printer->Print("      $dependency$.getDescriptor(),\n", "dependency",
                   dependency);
  }

  printer->Print("    });\n");
}